

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_header.hpp
# Opt level: O2

void pstore::serialize::serializer<pstore::extent<pstore::repo::compilation>,void>::
     read<pstore::serialize::archive::database_reader&>(database_reader *archive,value_type *r)

{
  unsigned_long uVar1;
  unsigned_long uVar2;
  
  uVar1 = read<unsigned_long,pstore::serialize::archive::database_reader&>(archive);
  uVar2 = read<unsigned_long,pstore::serialize::archive::database_reader&>(archive);
  (r->addr).a_.a_ = uVar1;
  r->size = uVar2;
  return;
}

Assistant:

static void read (Archive && archive, value_type & r) {
                auto const addr = typed_address<T>::make (serialize::read<std::uint64_t> (archive));
                auto const size = serialize::read<std::uint64_t> (archive);
                new (&r) extent<T> (addr, size);
            }